

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O3

int mac_method_hmac_sha2_256_hash
              (LIBSSH2_SESSION *session,uchar *buf,uint32_t seqno,uchar *packet,size_t packet_len,
              uchar *addtl,size_t addtl_len,void **abstract)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  EVP_MAC_CTX *local_40;
  uchar local_34 [4];
  
  _libssh2_htonu32(local_34,seqno);
  iVar1 = _libssh2_hmac_ctx_init(&local_40);
  if (iVar1 == 0) {
    uVar3 = 1;
  }
  else {
    iVar1 = _libssh2_hmac_sha256_init(&local_40,*abstract,0x20);
    uVar3 = 1;
    if (iVar1 != 0) {
      iVar1 = _libssh2_hmac_update(&local_40,local_34,4);
      if (iVar1 != 0) {
        iVar1 = _libssh2_hmac_update(&local_40,packet,packet_len);
        if ((addtl == (uchar *)0x0 || iVar1 == 0) || addtl_len == 0) {
          uVar2 = (uint)(iVar1 != 0);
        }
        else {
          uVar2 = _libssh2_hmac_update(&local_40,addtl,addtl_len);
        }
        if (uVar2 != 0) {
          iVar1 = _libssh2_hmac_final(&local_40,buf);
          uVar3 = (uint)(iVar1 == 0);
        }
      }
    }
    _libssh2_hmac_cleanup(&local_40);
  }
  return uVar3;
}

Assistant:

static int
mac_method_hmac_sha2_256_hash(LIBSSH2_SESSION * session,
                              unsigned char *buf, uint32_t seqno,
                              const unsigned char *packet,
                              size_t packet_len,
                              const unsigned char *addtl,
                              size_t addtl_len, void **abstract)
{
    libssh2_hmac_ctx ctx;
    unsigned char seqno_buf[4];
    int res;
    (void)session;

    _libssh2_htonu32(seqno_buf, seqno);

    if(!_libssh2_hmac_ctx_init(&ctx))
        return 1;
    res = _libssh2_hmac_sha256_init(&ctx, *abstract, 32) &&
          _libssh2_hmac_update(&ctx, seqno_buf, 4) &&
          _libssh2_hmac_update(&ctx, packet, packet_len);
    if(res && addtl && addtl_len)
        res = _libssh2_hmac_update(&ctx, addtl, addtl_len);
    if(res)
        res = _libssh2_hmac_final(&ctx, buf);
    _libssh2_hmac_cleanup(&ctx);

    return !res;
}